

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O3

doublecomplex z_sgn(doublecomplex *z)

{
  undefined1 auVar1 [16];
  double dVar2;
  doublecomplex dVar3;
  
  dVar2 = z_abs(z);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    auVar1._8_8_ = dVar2;
    auVar1._0_8_ = dVar2;
    dVar3 = (doublecomplex)divpd((undefined1  [16])*z,auVar1);
  }
  else {
    dVar3 = (doublecomplex)ZEXT816(0x3ff0000000000000);
  }
  return dVar3;
}

Assistant:

doublecomplex z_sgn(doublecomplex *z)
{
    register double t = z_abs(z);
    register doublecomplex retval;

    if (t == 0.0) {
	retval.r = 1.0, retval.i = 0.0;
    } else {
	retval.r = z->r / t, retval.i = z->i / t;
    }

    return retval;
}